

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OS_linux_common.cpp
# Opt level: O3

string * OS::trim(string *__return_storage_ptr__,string *str)

{
  long lVar1;
  long lVar2;
  string *extraout_RAX;
  string *psVar3;
  string *extraout_RAX_00;
  string whitespace;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48," \t","");
  lVar1 = std::__cxx11::string::find_first_not_of((char *)str,(ulong)local_48[0],0);
  lVar2 = std::__cxx11::string::find_last_not_of((char *)str,(ulong)local_48[0],0xffffffffffffffff);
  if (lVar1 == -1 || lVar2 == -1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    psVar3 = extraout_RAX;
  }
  else {
    psVar3 = (string *)std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)str);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
    psVar3 = extraout_RAX_00;
  }
  return psVar3;
}

Assistant:

static std::string trim(const std::string& str)
{
    const std::string whitespace(" \t");
    const auto start = str.find_first_not_of(whitespace);
    const auto end = str.find_last_not_of(whitespace);

    if( start == std::string::npos || end == std::string::npos )
    {
        return "";
    }

    return str.substr(start, end - start + 1);
}